

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::PopFocusScope(void)

{
  int iVar1;
  ImGuiContext *pIVar2;
  ImGuiID IVar3;
  
  pIVar2 = GImGui;
  iVar1 = (GImGui->FocusScopeStack).Size;
  if ((long)iVar1 != 0) {
    (GImGui->FocusScopeStack).Size = iVar1 + -1;
    if (iVar1 + -1 == 0) {
      IVar3 = 0;
    }
    else {
      IVar3 = (pIVar2->FocusScopeStack).Data[(long)iVar1 + -2].ID;
    }
    pIVar2->CurrentFocusScopeId = IVar3;
  }
  return;
}

Assistant:

void ImGui::PopFocusScope()
{
    ImGuiContext& g = *GImGui;
    if (g.FocusScopeStack.Size == 0)
    {
        IM_ASSERT_USER_ERROR(g.FocusScopeStack.Size > 0, "Calling PopFocusScope() too many times!");
        return;
    }
    g.FocusScopeStack.pop_back();
    g.CurrentFocusScopeId = g.FocusScopeStack.Size ? g.FocusScopeStack.back().ID : 0;
}